

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_base.cpp
# Opt level: O0

ConverterBase * __thiscall Gray16::ConverterBase::convert(ConverterBase *this,QImage *originalImage)

{
  int iVar1;
  QDebug *o;
  QImage *in_RDX;
  QMessageLogger local_58;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QImage *local_20;
  QImage *originalImage_local;
  ConverterBase *this_local;
  
  local_20 = in_RDX;
  originalImage_local = originalImage;
  this_local = this;
  iVar1 = QImage::format();
  if (iVar1 == 0x1c) {
    (**(code **)(*(long *)originalImage + 0x18))(this,originalImage,local_20);
  }
  else {
    QMessageLogger::QMessageLogger(&local_58,(char *)0x0,0,(char *)0x0);
    QMessageLogger::critical();
    o = QDebug::operator<<(&local_38,"Source image not Format_grayscale16:");
    QDebug::QDebug(&local_30,o);
    QImage::format();
    operator<<(&local_28,(Format)&local_30);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    QImage::QImage((QImage *)this,local_20);
  }
  return this;
}

Assistant:

QImage ConverterBase::convert(const QImage &originalImage) const {
  if(originalImage.format() != QImage::Format_Grayscale16) {
    qCritical() << "Source image not Format_grayscale16:" << originalImage.format();

    return originalImage;
  }

  return mConvert(originalImage);
}